

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::CampaignManager::Record
          (CampaignManager *this,string *name,size_t step,double time)

{
  double dVar1;
  iterator __position;
  iterator __position_00;
  ostream *poVar2;
  iterator iVar3;
  long lVar4;
  CampaignRecord r;
  double local_78;
  size_t local_70;
  CampaignRecord local_68;
  
  local_78 = time;
  local_70 = step;
  if (0 < (this->m_Options).verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Campaign Manager ",0x11);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,this->m_WriterRank);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   Record name = ",0x11);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," step = ",8);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," time = ",8);
    poVar2 = std::ostream::_M_insert<double>(time);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->cmap)._M_h,name);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
      ._M_cur == (__node_type *)0x0) {
    CampaignRecord::CampaignRecord(&local_68,step,time);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::core::engine::CampaignRecord>,std::allocator<std::pair<std::__cxx11::string_const,adios2::core::engine::CampaignRecord>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,adios2::core::engine::CampaignRecord&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::core::engine::CampaignRecord>,std::allocator<std::pair<std::__cxx11::string_const,adios2::core::engine::CampaignRecord>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->cmap,name,&local_68);
    if (local_68.times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_68.steps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.steps.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    __position._M_current =
         *(unsigned_long **)
          ((long)iVar3.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                 ._M_cur + 0x30);
    lVar4 = step - __position._M_current[-1];
    if ((long)__position._M_current -
        *(long *)((long)iVar3.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                        ._M_cur + 0x28) == 8) {
      dVar1 = *(double *)
               (*(long *)((long)iVar3.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                                ._M_cur + 0x50) + -8);
      *(long *)((long)iVar3.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                      ._M_cur + 0x40) = lVar4;
      *(double *)
       ((long)iVar3.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
              ._M_cur + 0x60) = time - dVar1;
    }
    else if (__position._M_current[-1] - __position._M_current[-2] != lVar4) {
      *(undefined8 *)
       ((long)iVar3.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
              ._M_cur + 0x40) = 0;
      *(undefined8 *)
       ((long)iVar3.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
              ._M_cur + 0x60) = 0;
      *(undefined1 *)
       ((long)iVar3.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
              ._M_cur + 0x68) = 1;
    }
    if (__position._M_current ==
        *(unsigned_long **)
         ((long)iVar3.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                ._M_cur + 0x38)) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                        ._M_cur + 0x28),__position,&local_70);
    }
    else {
      *__position._M_current = step;
      *(unsigned_long **)
       ((long)iVar3.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
              ._M_cur + 0x30) = __position._M_current + 1;
    }
    __position_00._M_current =
         *(double **)
          ((long)iVar3.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                 ._M_cur + 0x50);
    if (__position_00._M_current ==
        *(double **)
         ((long)iVar3.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                ._M_cur + 0x58)) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
                        ._M_cur + 0x48),__position_00,&local_78);
    }
    else {
      *__position_00._M_current = time;
      *(double **)
       ((long)iVar3.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
              ._M_cur + 0x50) = __position_00._M_current + 1;
    }
  }
  return;
}

Assistant:

void CampaignManager::Record(const std::string &name, const size_t step, const double time)
{
    if (m_Options.verbose > 0)
    {
        std::cout << "Campaign Manager " << m_WriterRank << "   Record name = " << name
                  << " step = " << step << " time = " << time << "\n";
    }
    auto r = cmap.find(name);
    if (r != cmap.end())
    {
        // update record
        size_t last_step = r->second.steps.back();
        size_t delta_step = step - last_step;
        double last_time = r->second.times.back();
        double delta_time = time - last_time;
        auto nsteps = r->second.steps.size();
        if (nsteps == 1)
        {
            r->second.delta_step = delta_step;
            r->second.delta_time = delta_time;
        }
        else
        {
            size_t old_delta_step = r->second.steps.back() - r->second.steps.rbegin()[1];
            if (old_delta_step != delta_step)
            {
                r->second.delta_step = 0;
                r->second.delta_time = 0.0;
                r->second.varying_deltas = true;
            }
        }
        r->second.steps.push_back(step);
        r->second.times.push_back(time);
    }
    else
    {
        // new entry
        CampaignRecord r(step, time);
        cmap.emplace(name, r);
    }
}